

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,void *ptr)

{
  ImU32 IVar1;
  value_type_conflict2 *pvVar2;
  void *ptr_local;
  
  ptr_local = ptr;
  pvVar2 = ImVector<unsigned_int>::back(&this->IDStack);
  IVar1 = ImHash(&ptr_local,8,*pvVar2);
  if (GImGui->ActiveId == IVar1) {
    GImGui->ActiveIdIsAlive = true;
  }
  return IVar1;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHash(&ptr, sizeof(void*), seed);
    ImGui::KeepAliveID(id);
    return id;
}